

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O2

bool __thiscall TextBuffer::deserialize_changes(TextBuffer *this,Deserializer *deserializer)

{
  Layer *previous_layer;
  bool bVar1;
  uint uVar2;
  Layer *this_00;
  Patch local_60;
  
  previous_layer = this->base_layer;
  if ((this->top_layer == previous_layer) && (previous_layer->previous_layer == (Layer *)0x0)) {
    this_00 = (Layer *)operator_new(0xa0);
    Layer::Layer(this_00,previous_layer);
    this->top_layer = this_00;
    uVar2 = Deserializer::read<unsigned_int>(deserializer);
    this->top_layer->size_ = uVar2;
    Point::Point((Point *)&local_60,deserializer);
    this->top_layer->extent_ = (Point)local_60.root;
    Patch::Patch(&local_60,deserializer);
    Patch::operator=(&this->top_layer->patch,&local_60);
    Patch::~Patch(&local_60);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool TextBuffer::deserialize_changes(Deserializer &deserializer) {
  if (top_layer != base_layer || base_layer->previous_layer) return false;
  top_layer = new Layer(base_layer);
  top_layer->size_ = deserializer.read<uint32_t>();
  top_layer->extent_ = Point(deserializer);
  top_layer->patch = Patch(deserializer);
  return true;
}